

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::writePCR(TSMuxer *this,int64_t newPCR)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if (((this->m_cbrBitrate != -1) && (this->m_minBitrate != -1)) && (this->m_lastPCR != -1)) {
    iVar1 = lroundl();
    uVar3 = iVar1 - this->m_pcrBits;
    if (uVar3 != 0 && this->m_pcrBits <= iVar1) {
      iVar2 = (int)((long)(ulong)(uVar3 >> 3) / (long)this->m_frameSize);
      iVar2 = (uint)(this->m_frameSize * iVar2 * 8 < (int)uVar3) + iVar2;
      writeNullPackets(this,iVar2);
      iVar2 = iVar2 * this->m_frameSize * 8 - uVar3;
      if (this->m_cbrBitrate != this->m_minBitrate) {
        iVar2 = 0;
      }
    }
  }
  this->m_pcrBits = iVar2;
  writeEmptyPacketWithPCR(this,newPCR);
  this->m_lastPCR = newPCR;
  return;
}

Assistant:

void TSMuxer::writePCR(const int64_t newPCR)
{
    int bitsRest = 0;
    if (m_cbrBitrate != -1 && m_minBitrate != -1 && m_lastPCR != -1)
    {
        int expectedBits = lroundl(static_cast<double>(newPCR - m_lastPCR) / 90000.0 * m_minBitrate);
        expectedBits -= m_pcrBits;
        if (expectedBits > 0)
        {
            int tsFrames = expectedBits / 8 / m_frameSize;
            if (tsFrames * m_frameSize * 8 < expectedBits)
                tsFrames++;
            writeNullPackets(tsFrames);
            if (m_cbrBitrate == m_minBitrate)
                bitsRest = (tsFrames * m_frameSize * 8) - expectedBits;
        }
    }
    m_pcrBits = bitsRest;
    // assert(m_pcrBits % 8 == 0);
    writeEmptyPacketWithPCR(newPCR);
    m_lastPCR = newPCR;
}